

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

bool dxil_spv::can_optimize_conditional_branch_to_static(Impl *impl,Value *value,bool *static_cond)

{
  uint uVar1;
  bool bVar2;
  Predicate PVar3;
  BinaryOps BVar4;
  CmpInst *this;
  Value *pVVar5;
  Constant *pCVar6;
  APInt *pAVar7;
  uint64_t uVar8;
  BinaryOperator *this_00;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t lower_bound;
  uint64_t upper_bound;
  ConstantInt *num;
  BinaryOperator *lhs;
  uint64_t rhs_value;
  ConstantInt *rhs;
  CmpInst *comp_inst;
  bool *static_cond_local;
  Value *value_local;
  Impl *impl_local;
  
  this = LLVMBC::dyn_cast<LLVMBC::CmpInst>(value);
  if (this == (CmpInst *)0x0) {
    impl_local._7_1_ = false;
  }
  else {
    PVar3 = LLVMBC::CmpInst::getPredicate(this);
    if (PVar3 == ICMP_UGT) {
      pVVar5 = LLVMBC::Instruction::getOperand(&this->super_Instruction,1);
      pCVar6 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(pVVar5)->super_Constant;
      if (pCVar6 == (Constant *)0x0) {
        impl_local._7_1_ = false;
      }
      else {
        pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
        uVar8 = LLVMBC::APInt::getZExtValue(pAVar7);
        pVVar5 = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
        this_00 = LLVMBC::dyn_cast<LLVMBC::BinaryOperator>(pVVar5);
        if (this_00 == (BinaryOperator *)0x0) {
          impl_local._7_1_ = false;
        }
        else {
          BVar4 = LLVMBC::BinaryOperator::getOpcode(this_00);
          if (BVar4 == UDiv) {
            pVVar5 = LLVMBC::Instruction::getOperand(&this_00->super_Instruction,0);
            pCVar6 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(pVVar5)->super_Constant;
            if (pCVar6 == (Constant *)0x0) {
              impl_local._7_1_ = false;
            }
            else {
              pVVar5 = LLVMBC::Instruction::getOperand(&this_00->super_Instruction,1);
              bVar2 = value_is_dx_op_instrinsic(pVVar5,WaveGetLaneCount);
              if (bVar2) {
                pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
                uVar9 = LLVMBC::APInt::getZExtValue(pAVar7);
                uVar1 = (impl->options).subgroup_size.implementation_minimum;
                pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
                uVar10 = LLVMBC::APInt::getZExtValue(pAVar7);
                if (uVar8 < uVar10 / (impl->options).subgroup_size.implementation_maximum) {
                  *static_cond = true;
                  impl_local._7_1_ = true;
                }
                else if (uVar8 < uVar9 / uVar1) {
                  *static_cond = false;
                  impl_local._7_1_ = false;
                }
                else {
                  *static_cond = false;
                  impl_local._7_1_ = true;
                }
              }
              else {
                impl_local._7_1_ = false;
              }
            }
          }
          else {
            impl_local._7_1_ = false;
          }
        }
      }
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  return impl_local._7_1_;
}

Assistant:

bool can_optimize_conditional_branch_to_static(
    Converter::Impl &impl, const llvm::Value *value, bool &static_cond)
{
	// Can be expanded as needed.
	// For now, search for common exhaustive loop unrolling patterns that DXC farts out.
	// Expect pattern of:
	// lower_bounded_expression > constant.
	// In the shader we've seen, we have: constant / WaveGetLaneCount(), which
	// we must narrow the bound of to avoid generating invalid code.
	const auto *comp_inst = llvm::dyn_cast<llvm::CmpInst>(value);
	if (!comp_inst)
		return false;

	if (comp_inst->getPredicate() != llvm::CmpInst::Predicate::ICMP_UGT)
		return false;

	const auto *rhs = llvm::dyn_cast<llvm::ConstantInt>(comp_inst->getOperand(1));
	if (!rhs)
		return false;

	uint64_t rhs_value = rhs->getUniqueInteger().getZExtValue();

	const auto *lhs = llvm::dyn_cast<llvm::BinaryOperator>(comp_inst->getOperand(0));
	if (!lhs)
		return false;

	if (lhs->getOpcode() != llvm::BinaryOperator::BinaryOps::UDiv)
		return false;

	const auto *num = llvm::dyn_cast<llvm::ConstantInt>(lhs->getOperand(0));
	if (!num)
		return false;
	if (!value_is_dx_op_instrinsic(lhs->getOperand(1), DXIL::Op::WaveGetLaneCount))
		return false;

	uint64_t upper_bound =
	    num->getUniqueInteger().getZExtValue() / impl.options.subgroup_size.implementation_minimum;
	uint64_t lower_bound =
		num->getUniqueInteger().getZExtValue() / impl.options.subgroup_size.implementation_maximum;

	if (lower_bound > rhs_value)
	{
		static_cond = true;
		return true;
	}
	else if (rhs_value >= upper_bound)
	{
		static_cond = false;
		return true;
	}
	else
	{
		static_cond = false;
		return false;
	}
}